

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# equality.cpp
# Opt level: O0

void __thiscall
Equality_componentEqual_Test::~Equality_componentEqual_Test(Equality_componentEqual_Test *this)

{
  Equality_componentEqual_Test *this_local;
  
  ~Equality_componentEqual_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Equality, componentEqual)
{
    libcellml::ComponentPtr c1 = libcellml::Component::create("c");
    libcellml::ComponentPtr c2 = libcellml::Component::create("c");

    libcellml::ComponentPtr cChild1 = libcellml::Component::create("child");
    libcellml::ComponentPtr cChild2 = libcellml::Component::create("child");

    libcellml::VariablePtr v1 = libcellml::Variable::create("vA");
    libcellml::VariablePtr v2 = libcellml::Variable::create("vA");

    libcellml::ResetPtr r1 = libcellml::Reset::create();
    libcellml::ResetPtr r2 = libcellml::Reset::create();

    r1->setOrder(5);
    r2->setOrder(5);

    c1->addComponent(cChild1);
    c2->addComponent(cChild2);

    c1->addVariable(v1);
    c2->addVariable(v2);

    c1->addReset(r1);
    c2->addReset(r2);

    EXPECT_TRUE(c1->equals(c2));
    EXPECT_TRUE(c2->equals(c1));
}